

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rational.hpp
# Opt level: O2

rational<int> tcb::operator*(short *lhs,rational<short> *rhs)

{
  rational<int> rVar1;
  rational<int> local_10;
  
  local_10.num_ = (int)rhs->num_ * (int)*lhs;
  local_10.denom_ = (value_type_conflict)rhs->denom_;
  rational<int>::simplify(&local_10);
  rVar1.denom_ = local_10.denom_;
  rVar1.num_ = local_10.num_;
  return rVar1;
}

Assistant:

constexpr auto
operator*(const T& lhs, const U& rhs)
{
    using value_type = decltype(std::declval<rational_value_t<T>>() *
            std::declval<rational_value_t<U>>());
    return rational<value_type>{
            numerator(lhs) * numerator(rhs),
            denominator(lhs) * denominator(rhs)};
}